

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O0

void __thiscall
duckdb::Serializer::
WritePropertyWithDefault<duckdb::unique_ptr<duckdb::BlockingSample,std::default_delete<duckdb::BlockingSample>,true>>
          (Serializer *this,field_id_t field_id,char *tag,
          unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true>
          *value,unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true>
                 *default_value)

{
  bool bVar1;
  undefined8 in_RDX;
  undefined2 in_SI;
  Serializer *in_RDI;
  unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>
  *in_stack_ffffffffffffffc8;
  
  if ((((in_RDI->options).serialize_default_values & 1U) == 0) &&
     (bVar1 = ::std::operator==((unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>
                                 *)in_RDI,in_stack_ffffffffffffffc8), bVar1)) {
    (*(code *)(((__uniq_ptr_data<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true,_true>
                 *)&in_RDI->_vptr_Serializer)->
              super___uniq_ptr_impl<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>
              )._M_t.
              super__Tuple_impl<0UL,_duckdb::BlockingSample_*,_std::default_delete<duckdb::BlockingSample>_>
              .super__Head_base<0UL,_duckdb::BlockingSample_*,_false>._M_head_impl[1].
              base_reservoir_sample.
              super_unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>_>
              ._M_t)(in_RDI,in_SI,in_RDX,0);
    (**(code **)&(((__uniq_ptr_data<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true,_true>
                    *)&in_RDI->_vptr_Serializer)->
                 super___uniq_ptr_impl<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>
                 )._M_t.
                 super__Tuple_impl<0UL,_duckdb::BlockingSample_*,_std::default_delete<duckdb::BlockingSample>_>
                 .super__Head_base<0UL,_duckdb::BlockingSample_*,_false>._M_head_impl[1].type)
              (in_RDI,0);
  }
  else {
    (*(code *)(((__uniq_ptr_data<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true,_true>
                 *)&in_RDI->_vptr_Serializer)->
              super___uniq_ptr_impl<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>_>
              )._M_t.
              super__Tuple_impl<0UL,_duckdb::BlockingSample_*,_std::default_delete<duckdb::BlockingSample>_>
              .super__Head_base<0UL,_duckdb::BlockingSample_*,_false>._M_head_impl[1].
              base_reservoir_sample.
              super_unique_ptr<duckdb::BaseReservoirSampling,_std::default_delete<duckdb::BaseReservoirSampling>_>
              ._M_t)(in_RDI,in_SI,in_RDX,1);
    WriteValue<duckdb::BlockingSample>
              (in_RDI,(unique_ptr<duckdb::BlockingSample,_std::default_delete<duckdb::BlockingSample>,_true>
                       *)in_stack_ffffffffffffffc8);
    (*in_RDI->_vptr_Serializer[5])(in_RDI,1);
  }
  return;
}

Assistant:

void WritePropertyWithDefault(const field_id_t field_id, const char *tag, const T &value, const T &default_value) {
		// If current value is default, don't write it
		if (!options.serialize_default_values && (value == default_value)) {
			OnOptionalPropertyBegin(field_id, tag, false);
			OnOptionalPropertyEnd(false);
			return;
		}
		OnOptionalPropertyBegin(field_id, tag, true);
		WriteValue(value);
		OnOptionalPropertyEnd(true);
	}